

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::NeuralNetworkImageScaler::ByteSizeLong(NeuralNetworkImageScaler *this)

{
  int iVar1;
  float fVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  NeuralNetworkImageScaler *this_local;
  
  sStack_18 = 0;
  fVar2 = graybias(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    sStack_18 = 6;
  }
  fVar2 = channelscale(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    sStack_18 = sStack_18 + 5;
  }
  fVar2 = bluebias(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    sStack_18 = sStack_18 + 6;
  }
  fVar2 = greenbias(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    sStack_18 = sStack_18 + 6;
  }
  fVar2 = redbias(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    sStack_18 = sStack_18 + 6;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t NeuralNetworkImageScaler::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkImageScaler)
  size_t total_size = 0;

  // float grayBias = 30;
  if (this->graybias() != 0) {
    total_size += 2 + 4;
  }

  // float channelScale = 10;
  if (this->channelscale() != 0) {
    total_size += 1 + 4;
  }

  // float blueBias = 20;
  if (this->bluebias() != 0) {
    total_size += 2 + 4;
  }

  // float greenBias = 21;
  if (this->greenbias() != 0) {
    total_size += 2 + 4;
  }

  // float redBias = 22;
  if (this->redbias() != 0) {
    total_size += 2 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}